

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpness_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1ae0c45::SharpnessTest::DoTest(SharpnessTest *this)

{
  undefined8 *puVar1;
  bool bVar2;
  Y4mVideoSource *this_00;
  _Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  mapped_type *pmVar3;
  AssertHelper AVar4;
  SEARCH_METHODS *pSVar5;
  double psnr;
  AssertionResult gtest_ar;
  unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> video;
  AssertHelper local_60;
  AssertHelper local_58;
  undefined1 local_50 [16];
  long local_40 [2];
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> local_30;
  AssertHelper local_28;
  
  (this->super_EncoderTest).init_flags_ = 0x10000;
  this_00 = (Y4mVideoSource *)operator_new(0xd8);
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"paris_352_288_30.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(this_00,(string *)local_50,0,10);
  local_30._M_head_impl = (VideoSource *)this_00;
  if ((long *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  local_58.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            ((internal *)local_50,"video","nullptr",
             (unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )&local_30,&local_58.data_);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
               ,100,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    AVar4.data_ = local_58.data_;
LAB_006a5930:
    if (AVar4.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)AVar4.data_ + 8))();
    }
LAB_006a593b:
    puVar1 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
  }
  else {
    puVar1 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        (*(this->super_EncoderTest)._vptr_EncoderTest[2])
                  (&this->super_EncoderTest,local_30._M_head_impl);
      }
      bVar2 = local_50[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      if (bVar2 == false) {
        local_58.data_ = (AssertHelperData *)0x0;
        if (this->nframes_ != 0) {
          local_58.data_ = (AssertHelperData *)(this->psnr_ / (double)this->nframes_);
        }
        local_28.data_._0_4_ = *(undefined4 *)&(this->super_EncoderTest).field_0x3dc;
        this_01 = (_Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(anonymous_namespace)::kPsnrThreshold,(key_type *)&local_28);
        this_02 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>,_std::allocator<std::pair<const_int,_std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at(this_01,&this->cpu_used_);
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at(this_02,&this->sharpness_level_);
        local_60.data_ = (AssertHelperData *)*pmVar3;
        testing::internal::CmpHelperGT<double,double>
                  ((internal *)local_50,"psnr","GetPsnrThreshold()",(double *)&local_58,
                   (double *)&local_60);
        if (local_50[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_60);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,"encoding mode = ",0x10);
          std::ostream::operator<<
                    (&(local_60.data_)->line,*(int *)&(this->super_EncoderTest).field_0x3dc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,", cpu used = ",0xd);
          std::ostream::operator<<(&(local_60.data_)->line,this->cpu_used_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_60.data_)->line,", sharpness level = ",0x14);
          std::ostream::operator<<(&(local_60.data_)->line,this->sharpness_level_);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            pSVar5 = "";
          }
          else {
            pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
                     ,0x68,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          AVar4.data_ = local_60.data_;
          goto LAB_006a5930;
        }
        goto LAB_006a593b;
      }
    }
    testing::Message::Message((Message *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sharpness_test.cc"
               ,0x66,
               "Expected: RunLoop(video.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_50._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_50._0_8_ + 8))();
    }
  }
  if ((Y4mVideoSource *)local_30._M_head_impl != (Y4mVideoSource *)0x0) {
    (*((VideoSource *)&(local_30._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
  }
  return;
}

Assistant:

void DoTest() {
    init_flags_ = AOM_CODEC_USE_PSNR;

    std::unique_ptr<libaom_test::VideoSource> video(
        new libaom_test::Y4mVideoSource("paris_352_288_30.y4m", 0, kFrames));
    ASSERT_NE(video, nullptr);

    ASSERT_NO_FATAL_FAILURE(RunLoop(video.get()));
    const double psnr = GetAveragePsnr();
    EXPECT_GT(psnr, GetPsnrThreshold())
        << "encoding mode = " << encoding_mode_ << ", cpu used = " << cpu_used_
        << ", sharpness level = " << sharpness_level_;
  }